

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# odometry.c
# Opt level: O1

int odometry_receive_loop(void)

{
  int iVar1;
  int iVar2;
  ParametersPtr p_Var3;
  
  p_Var3 = get_param_ptr();
  g_interval = 0.005;
  iVar2 = serial_recieve(odometry_receive,(void *)0x0);
  iVar1 = p_Var3->parameter_applying;
  while (iVar1 != 0) {
    yprintf(OUTPUT_LV_INFO,"Restarting odometry receive loop.\n");
    iVar2 = serial_recieve(odometry_receive,(void *)0x0);
    iVar1 = p_Var3->parameter_applying;
  }
  return iVar2;
}

Assistant:

int odometry_receive_loop(void)
{
  int ret;
  Parameters* param;
  param = get_param_ptr();

  g_interval = SER_INTERVAL;
  while (1)
  {
    ret = serial_recieve(odometry_receive, NULL);
    if (param->parameter_applying)
    {
      yprintf(OUTPUT_LV_INFO, "Restarting odometry receive loop.\n");
      continue;
    }
    break;
  }

  return ret;
}